

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_backend.c
# Opt level: O0

int ec_set_include_public(EC_KEY *ec,int include)

{
  int in_ESI;
  EC_KEY *in_RDI;
  int flags;
  undefined4 local_10;
  
  local_10 = EC_KEY_get_enc_flags(in_RDI);
  if (in_ESI == 0) {
    local_10 = local_10 | 2;
  }
  else {
    local_10 = local_10 & 0xfffffffd;
  }
  EC_KEY_set_enc_flags(in_RDI,local_10);
  return 1;
}

Assistant:

static int ec_set_include_public(EC_KEY *ec, int include)
{
    int flags = EC_KEY_get_enc_flags(ec);

    if (!include)
        flags |= EC_PKEY_NO_PUBKEY;
    else
        flags &= ~EC_PKEY_NO_PUBKEY;
    EC_KEY_set_enc_flags(ec, flags);
    return 1;
}